

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_group.hpp
# Opt level: O2

void __thiscall boost::thread_group::~thread_group(thread_group *this)

{
  thread *this_00;
  iterator end;
  thread_group *ptVar1;
  
  ptVar1 = this;
  while (ptVar1 = (thread_group *)
                  (ptVar1->threads).
                  super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>._M_impl.
                  _M_node.super__List_node_base._M_next, ptVar1 != this) {
    this_00 = (thread *)
              (ptVar1->threads).super__List_base<boost::thread_*,_std::allocator<boost::thread_*>_>.
              _M_impl._M_node._M_size;
    if (this_00 != (thread *)0x0) {
      thread::~thread(this_00);
    }
    operator_delete(this_00,0x10);
  }
  shared_mutex::~shared_mutex(&this->m);
  std::__cxx11::_List_base<boost::thread_*,_std::allocator<boost::thread_*>_>::_M_clear
            ((_List_base<boost::thread_*,_std::allocator<boost::thread_*>_> *)this);
  return;
}

Assistant:

~thread_group()
        {
            for(std::list<thread*>::iterator it=threads.begin(),end=threads.end();
                it!=end;
                ++it)
            {
                delete *it;
            }
        }